

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::print(Board *this)

{
  TileValue TVar1;
  ostream *poVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar5 = 0;
  while (uVar4 = uVar5, uVar4 < this->SIZE) {
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    uVar5 = 0;
    while (uVar6 = uVar5, uVar6 < this->SIZE) {
      TVar1 = (this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
              super__Vector_impl_data._M_start[this->SIZE * uVar4 + uVar6].value;
      cVar3 = (char)TVar1 + '0';
      if (TVar1 == Empty) {
        cVar3 = '-';
      }
      poVar2 = std::operator<<((ostream *)&std::cout,"  ");
      poVar2 = std::operator<<(poVar2,cVar3);
      std::operator<<(poVar2," ");
      uVar5 = uVar6 + 1;
      if ((uVar5 % this->SQUARE_SIZE == 0) && (uVar6 != this->SIZE - 1)) {
        std::operator<<((ostream *)&std::cout,"|");
      }
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    uVar5 = uVar4 + 1;
    if ((uVar5 % this->SQUARE_SIZE == 0) && (uVar4 != this->SIZE - 1)) {
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct((ulong)local_50,'&');
      poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_50);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)local_50);
    }
  }
  return;
}

Assistant:

void Board::print() const
{
	for (row r = 0; r < Board::SIZE; r++)
	{
		std::cout << std::endl;

		for (column c = 0; c < Board::SIZE; c++)
		{
			auto tile = _tiles[translate(c, r, Board::SIZE)];
			auto value = tile.value == TileValue::Empty ? '-' : static_cast<char>((int)tile.value + 48);

			std::cout << "  " << value << " ";

			if ((c + 1) % Board::SQUARE_SIZE == 0 && c != Board::SIZE - 1)
				std::cout << "|";
		}

		std::cout << std::endl;

		if ((r + 1) % Board::SQUARE_SIZE == 0 && r != Board::SIZE - 1)
		{
			std::cout << std::string(38, '_') << std::endl;
		}
	}

}